

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveIn::in<myEmployeeBoss>
          (ChArchiveIn *this,ChNameValue<std::shared_ptr<myEmployeeBoss>_> *bVal)

{
  int iVar1;
  undefined4 extraout_var;
  __shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator iVar2;
  unordered_map<void_*,_std::shared_ptr<void>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>_>
  *this_01;
  myEmployeeBoss *mptr;
  ChFunctorArchiveInSpecificPtr<myEmployeeBoss> specFuncA;
  __shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2> local_60;
  myEmployeeBoss *local_50;
  myEmployeeBoss *local_48;
  undefined **local_40;
  myEmployeeBoss **local_38;
  char *local_30;
  undefined ***local_28;
  char local_20;
  
  local_28 = &local_40;
  local_38 = &local_50;
  local_40 = &PTR__ChFunctorArchiveIn_001629f0;
  local_30 = bVal->_name;
  local_20 = bVal->_flags;
  iVar1 = (*(this->super_ChArchive)._vptr_ChArchive[0xd])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    this_01 = &this->shared_ptr_map;
    local_60._M_ptr = local_50;
    iVar2 = std::
            _Hashtable<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_01->_M_h,&local_60._M_ptr);
    if (iVar2.super__Node_iterator_base<std::pair<void_*const,_std::shared_ptr<void>_>,_false>.
        _M_cur != (__node_type *)0x0) {
      local_48 = local_50;
      std::__detail::
      _Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)this_01,&local_48);
      std::static_pointer_cast<myEmployeeBoss,void>((shared_ptr<void> *)&local_60);
      std::__shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&bVal->_value->super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>,
                 &local_60);
      goto LAB_0013fd78;
    }
    std::__shared_ptr<myEmployeeBoss,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myEmployeeBoss,void>
              ((__shared_ptr<myEmployeeBoss,(__gnu_cxx::_Lock_policy)2> *)&local_60,local_50);
    std::__shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&bVal->_value->super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>,
               &local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    std::static_pointer_cast<void,myEmployeeBoss>((shared_ptr<myEmployeeBoss> *)&local_60);
    local_48 = local_50;
    this_00 = &std::__detail::
               _Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_01,&local_48)->
               super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>;
  }
  else {
    std::__shared_ptr<myEmployeeBoss,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myEmployeeBoss,void>
              ((__shared_ptr<myEmployeeBoss,(__gnu_cxx::_Lock_policy)2> *)&local_60,local_50);
    std::__shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&bVal->_value->super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>,
               &local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    std::static_pointer_cast<void,myEmployeeBoss>((shared_ptr<myEmployeeBoss> *)&local_60);
    local_48 = local_50;
    this_00 = &std::__detail::
               _Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->shared_ptr_map,&local_48)->
               super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,(__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)&local_60);
LAB_0013fd78:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  return;
}

Assistant:

void in     (ChNameValue< std::shared_ptr<T> > bVal) {
          T* mptr;
          ChFunctorArchiveInSpecificPtr<T> specFuncA(&mptr);
          ChNameValue<ChFunctorArchiveIn> mtmp(bVal.name(), specFuncA, bVal.flags());
          void* newptr = this->in_ref(mtmp);

          // Some additional complication respect to raw pointers: 
          // it must properly increment shared count of shared pointers.
          if(newptr) {
              // case A: new object, so just make a shared ptr with initial count=1
              bVal.value() = std::shared_ptr<T> ( mptr ); 
              this->shared_ptr_map[mptr] = std::static_pointer_cast<void>(bVal.value());
          }
          else {
              if (this->shared_ptr_map.find(mptr) != this->shared_ptr_map.end()) {
                  // case B1: preexisting object, previously referenced by a shared ptr, so increment ref count
                  bVal.value() = std::static_pointer_cast<T>(shared_ptr_map[mptr]);
              }
              else {
                  // case B2: preexisting object, but not referenced by shared ptr (maybe by some raw ptr) so just make a shared ptr with initial count=1
                  bVal.value() = std::shared_ptr<T> ( mptr ); 
                  this->shared_ptr_map[mptr] = std::static_pointer_cast<void>(bVal.value());
              }
          }
      }